

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::can_compress_content_type(string *content_type)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  bool local_21;
  uint tag;
  string *content_type_local;
  
  uVar1 = str2tag(content_type);
  if ((((uVar1 == 0xa0a74526) || (uVar1 == 0x40cb462)) || (uVar1 == 0x301accd8)) ||
     (((uVar1 == 0x36c726b2 || (uVar1 == 0x46348aed)) || (uVar1 == 0x6ebb6a6c)))) {
    content_type_local._7_1_ = true;
  }
  else {
    lVar3 = std::__cxx11::string::rfind((char *)content_type,0x1c274c);
    local_21 = false;
    if (lVar3 == 0) {
      uVar2 = udl::operator____t("text/event-stream",0x11);
      local_21 = uVar1 != uVar2;
    }
    content_type_local._7_1_ = local_21;
  }
  return content_type_local._7_1_;
}

Assistant:

inline bool can_compress_content_type(const std::string &content_type) {
  using udl::operator""_t;

  auto tag = str2tag(content_type);

  switch (tag) {
  case "image/svg+xml"_t:
  case "application/javascript"_t:
  case "application/json"_t:
  case "application/xml"_t:
  case "application/protobuf"_t:
  case "application/xhtml+xml"_t: return true;

  default:
    return !content_type.rfind("text/", 0) && tag != "text/event-stream"_t;
  }
}